

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  Location loc;
  Location loc_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_R9;
  Location local_88;
  Location local_68;
  Location local_48;
  byte local_22;
  byte local_21;
  bool in_string;
  char *pcStack_20;
  bool has_error;
  char *saved_token_start;
  WastParser *parser_local;
  WastLexer *this_local;
  
  pcStack_20 = this->token_start_;
  local_21 = 0;
  local_22 = 1;
  saved_token_start = (char *)parser;
  parser_local = (WastParser *)this;
  ReadChar(this);
  do {
    do {
      while( true ) {
        while( true ) {
          if ((local_22 & 1) == 0) {
            this->token_start_ = pcStack_20;
            if ((local_21 & 1) == 0) {
              TextToken(__return_storage_ptr__,this,Text,0);
            }
            else {
              GetLocation(&local_88,this);
              loc_00.filename.size_ = local_88.filename.size_;
              loc_00.filename.data_ = local_88.filename.data_;
              loc_00.field_1.field_1.offset = local_88.field_1.field_1.offset;
              loc_00.field_1._8_8_ = local_88.field_1._8_8_;
              Token::Token(__return_storage_ptr__,loc_00,First);
            }
            return __return_storage_ptr__;
          }
          iVar3 = ReadChar(this);
          pcVar1 = saved_token_start;
          if (iVar3 == -1) {
            BareToken(__return_storage_ptr__,this,Eof);
            return __return_storage_ptr__;
          }
          if (iVar3 != 10) break;
          this->token_start_ = this->cursor_ + -1;
          GetLocation(&local_48,this);
          WastParser::Error((WastParser *)pcVar1,0x34315e);
          local_21 = 1;
          Newline(this);
        }
        if (iVar3 != 0x22) break;
        local_22 = 0;
      }
    } while (iVar3 != 0x5c);
    iVar3 = ReadChar(this);
    switch(iVar3) {
    case 0x22:
    case 0x27:
    case 0x5c:
    case 0x6e:
    case 0x72:
    case 0x74:
      break;
    default:
      this->token_start_ = this->cursor_ + -2;
LAB_002972a2:
      pcVar1 = saved_token_start;
      GetLocation(&local_68,this);
      loc.filename.size_ = local_68.filename.size_;
      loc.filename.data_ = local_68.filename.data_;
      loc.field_1.field_1.offset = local_68.field_1.field_1.offset;
      loc.field_1._8_8_ = local_68.field_1._8_8_;
      WastParser::Error((WastParser *)pcVar1,loc,"bad escape \"%.*s\"",
                        (ulong)(uint)((int)this->cursor_ - (int)this->token_start_),
                        this->token_start_,local_68.field_1.field_1.offset,in_R9);
      local_21 = 1;
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
      iVar3 = PeekChar(this);
      bVar2 = IsHexDigit(iVar3);
      if (!bVar2) {
        this->token_start_ = this->cursor_ + -2;
        goto LAB_002972a2;
      }
      ReadChar(this);
    }
  } while( true );
}

Assistant:

Token WastLexer::GetStringToken(WastParser* parser) {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}